

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_attribute.c
# Opt level: O0

apx_portAttributes_t * apx_portAttributes_new(void)

{
  apx_portAttributes_t *self_00;
  apx_portAttributes_t *self;
  
  self_00 = (apx_portAttributes_t *)malloc(0x10);
  if (self_00 != (apx_portAttributes_t *)0x0) {
    apx_portAttributes_create(self_00);
  }
  return self_00;
}

Assistant:

apx_portAttributes_t* apx_portAttributes_new(void)
{
   apx_portAttributes_t *self = (apx_portAttributes_t*) 0;
   self = (apx_portAttributes_t*) malloc(sizeof(apx_portAttributes_t));
   if (self != NULL)
   {
      apx_portAttributes_create(self);
   }
   return self;
}